

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Tags::~Tags(Tags *this)

{
  Tag *pTVar1;
  long in_RDI;
  Tag *tag;
  Tag *local_28;
  Tag *in_stack_ffffffffffffffe0;
  Tag *pTVar2;
  
  while (0 < *(int *)(in_RDI + 4)) {
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + -1;
    Tag::Clear(in_stack_ffffffffffffffe0);
  }
  pTVar2 = *(Tag **)(in_RDI + 8);
  if (pTVar2 != (Tag *)0x0) {
    pTVar1 = pTVar2 + -1;
    local_28 = pTVar2 + *(long *)&pTVar2[-1].simple_tags_size_;
    if (pTVar2 != local_28) {
      do {
        local_28 = local_28 + -1;
        Tag::~Tag(local_28);
      } while (local_28 != pTVar2);
    }
    operator_delete__(&pTVar1->simple_tags_size_);
  }
  *(undefined8 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

Tags::~Tags() {
  while (tags_count_ > 0) {
    Tag& tag = tags_[--tags_count_];
    tag.Clear();
  }

  delete[] tags_;
  tags_ = NULL;
}